

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_resize_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::AV1ResizeXTest_DISABLED_SpeedTest_Test::
~AV1ResizeXTest_DISABLED_SpeedTest_Test(AV1ResizeXTest_DISABLED_SpeedTest_Test *this)

{
  anon_unknown.dwarf_19cf73a::AV1ResizeXTest_DISABLED_SpeedTest_Test::
  ~AV1ResizeXTest_DISABLED_SpeedTest_Test((AV1ResizeXTest_DISABLED_SpeedTest_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(AV1ResizeXTest, DISABLED_SpeedTest) { SpeedTest(); }